

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vanilla_chronicle.cpp
# Opt level: O0

void __thiscall
cornelich::vanilla_chronicle::vanilla_chronicle
          (vanilla_chronicle *this,vanilla_chronicle_settings *settings)

{
  int64_t iVar1;
  type_conflict1 tVar2;
  __type_conflict1 _Var3;
  vanilla_chronicle_settings *settings_local;
  vanilla_chronicle *this_local;
  
  vanilla_chronicle_settings::vanilla_chronicle_settings(&this->m_settings,settings);
  iVar1 = vanilla_chronicle_settings::index_block_size(&this->m_settings);
  _Var3 = std::log2<long>(iVar1);
  this->m_index_block_size_bits = (int)_Var3;
  this->m_index_block_size_mask = (1L << ((byte)this->m_index_block_size_bits & 0x3f)) + -1;
  this->m_index_block_longs_bits = this->m_index_block_size_bits + -3;
  tVar2 = util::right_shift<long>(this->m_index_block_size_mask,3);
  this->m_index_block_longs_mask = tVar2;
  iVar1 = vanilla_chronicle_settings::data_block_size(&this->m_settings);
  _Var3 = std::log2<long>(iVar1);
  this->m_data_block_size_bits = (int)_Var3;
  this->m_data_block_size_mask = (1L << ((byte)this->m_data_block_size_bits & 0x3f)) + -1;
  iVar1 = vanilla_chronicle_settings::entries_per_cycle(&this->m_settings);
  _Var3 = std::log2<long>(iVar1);
  this->m_entries_for_cycle_bits = (int)_Var3;
  this->m_entries_for_cycle_mask = (1L << ((byte)this->m_entries_for_cycle_bits & 0x3f)) + -1;
  vanilla_index::vanilla_index(&this->m_index,&this->m_settings,this->m_index_block_size_bits);
  vanilla_data::vanilla_data(&this->m_data,&this->m_settings,this->m_data_block_size_bits);
  std::atomic<long>::atomic(&this->m_last_written_index,-1);
  return;
}

Assistant:

vanilla_chronicle::vanilla_chronicle(const vanilla_chronicle_settings & settings)
    : m_settings(settings)
    , m_index_block_size_bits( (std::int32_t)std::log2(m_settings.index_block_size()) )
    , m_index_block_size_mask( ((std::int64_t)1 << m_index_block_size_bits) - 1 )
    , m_index_block_longs_bits( m_index_block_size_bits - 3 )
    , m_index_block_longs_mask( util::right_shift(m_index_block_size_mask, 3) )
    , m_data_block_size_bits( (std::int32_t)std::log2(m_settings.data_block_size()) )
    , m_data_block_size_mask( ((std::int64_t)1 << m_data_block_size_bits) - 1 )
    , m_entries_for_cycle_bits( (std::int32_t)std::log2(m_settings.entries_per_cycle()) )
    , m_entries_for_cycle_mask( ((std::int64_t)1 << m_entries_for_cycle_bits) - 1 )
    , m_index(m_settings, m_index_block_size_bits)
    , m_data(m_settings, m_data_block_size_bits)
    , m_last_written_index(-1)
{
}